

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

uint Validator::constraintS3(Solution *solution)

{
  Turn *this;
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar5;
  Nurse *pNVar6;
  History *this_00;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar7;
  Scenario *pSVar8;
  string *psVar9;
  _Base_ptr p_Var10;
  pointer ppTVar11;
  uint local_10c;
  Contract local_100;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  _Rb_tree_node_base *local_40;
  pointer local_38;
  
  pmVar5 = Solution::getNurses_abi_cxx11_(solution);
  p_Var10 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var10 == local_40) {
    local_10c = 0;
  }
  else {
    local_10c = 0;
    do {
      pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
      this_00 = Nurse::getHistory(pNVar6);
      uVar2 = History::getNumberOfConsecutiveDaysOff(this_00);
      pvVar7 = NurseSolution::getTurns(*(NurseSolution **)(p_Var10 + 2));
      ppTVar11 = (pvVar7->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      local_38 = (pvVar7->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppTVar11 != local_38) {
        uVar2 = ~uVar2;
        do {
          this = *ppTVar11;
          iVar3 = Turn::getDay(this);
          iVar3 = ~uVar2 + iVar3;
          if (iVar3 != 0) {
            pSVar8 = Scenario::getInstance();
            pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
            psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            pcVar1 = (psVar9->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_60,pcVar1,pcVar1 + psVar9->_M_string_length);
            Scenario::getContract(&local_100,pSVar8,&local_60);
            iVar4 = Contract::getMinimumNumberOfConsecutiveDaysOff(&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100.id._M_dataplus._M_p != &local_100.id.field_2) {
              operator_delete(local_100.id._M_dataplus._M_p,
                              local_100.id.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if (iVar3 < iVar4) {
              pSVar8 = Scenario::getInstance();
              pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
              psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              pcVar1 = (psVar9->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_80,pcVar1,pcVar1 + psVar9->_M_string_length);
              Scenario::getContract(&local_100,pSVar8,&local_80);
              iVar4 = Contract::getMinimumNumberOfConsecutiveDaysOff(&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100.id._M_dataplus._M_p != &local_100.id.field_2) {
                operator_delete(local_100.id._M_dataplus._M_p,
                                local_100.id.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              local_10c = (iVar4 - iVar3) * 0x1e + local_10c;
            }
            else {
              pSVar8 = Scenario::getInstance();
              pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
              psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              pcVar1 = (psVar9->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,pcVar1,pcVar1 + psVar9->_M_string_length);
              Scenario::getContract(&local_100,pSVar8,&local_a0);
              iVar4 = Contract::getMaximumNumberOfConsecutiveDaysOff(&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100.id._M_dataplus._M_p != &local_100.id.field_2) {
                operator_delete(local_100.id._M_dataplus._M_p,
                                local_100.id.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar4 < iVar3) {
                pSVar8 = Scenario::getInstance();
                pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
                psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                pcVar1 = (psVar9->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_c0,pcVar1,pcVar1 + psVar9->_M_string_length);
                Scenario::getContract(&local_100,pSVar8,&local_c0);
                iVar4 = Contract::getMaximumNumberOfConsecutiveDaysOff(&local_100);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100.id._M_dataplus._M_p != &local_100.id.field_2) {
                  operator_delete(local_100.id._M_dataplus._M_p,
                                  local_100.id.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
                local_10c = (iVar3 - iVar4) * 0x1e + local_10c;
              }
            }
          }
          uVar2 = Turn::getDay(this);
          ppTVar11 = ppTVar11 + 1;
        } while (ppTVar11 != local_38);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_40);
  }
  return local_10c;
}

Assistant:

unsigned int Validator::constraintS3(const Solution &solution) {

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int numberOfConsecutiveDaysOff = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveDaysOff();

        int lastDay = - (numberOfConsecutiveDaysOff + 1);

        for(Turn * turn : nurse.second->getTurns())
        {
            int currentDay = turn->getDay();

            int CDays = currentDay - (lastDay + 1);

            if (CDays != 0) {
                if(CDays < Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMinimumNumberOfConsecutiveDaysOff())
                {
                    sum += 30 * (Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMinimumNumberOfConsecutiveDaysOff() - CDays);
                }
                else if (CDays > Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfConsecutiveDaysOff())
                {
                    sum += 30 * (CDays - Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfConsecutiveDaysOff());
                }
            }

            lastDay = turn->getDay();
        }
    }

    return sum;
}